

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall
glslang::TPpContext::extraTokenCheck(TPpContext *this,int contextAtom,TPpToken *ppToken,int token)

{
  TParseContextBase *pTVar1;
  char *pcVar2;
  
  if ((token != -1) && (token != 10)) {
    if (contextAtom - 0xa5U < 7) {
      pcVar2 = &DAT_0077515c + *(int *)(&DAT_0077515c + (ulong)(contextAtom - 0xa5U) * 4);
    }
    else {
      pcVar2 = "";
    }
    pTVar1 = this->parseContext;
    (*(pTVar1->super_TParseVersions)._vptr_TParseVersions
      [(ulong)((pTVar1->super_TParseVersions).messages & EShMsgRelaxedErrors) + 0x2f])
              (pTVar1,ppToken,"unexpected tokens following directive",pcVar2,"");
    while ((token != -1 && (token != 10))) {
      token = scanToken(this,ppToken);
    }
  }
  return token;
}

Assistant:

int TPpContext::extraTokenCheck(int contextAtom, TPpToken* ppToken, int token)
{
    if (token != '\n' && token != EndOfInput) {
        static const char* message = "unexpected tokens following directive";

        const char* label;
        if (contextAtom == PpAtomElse)
            label = "#else";
        else if (contextAtom == PpAtomElif)
            label = "#elif";
        else if (contextAtom == PpAtomEndif)
            label = "#endif";
        else if (contextAtom == PpAtomIf)
            label = "#if";
        else if (contextAtom == PpAtomLine)
            label = "#line";
        else
            label = "";

        if (parseContext.relaxedErrors())
            parseContext.ppWarn(ppToken->loc, message, label, "");
        else
            parseContext.ppError(ppToken->loc, message, label, "");

        while (token != '\n' && token != EndOfInput)
            token = scanToken(ppToken);
    }

    return token;
}